

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

void cfd::capi::GetTxInfo
               (AbstractTransaction *tx,char **txid,char **wtxid,uint32_t *size,uint32_t *vsize,
               uint32_t *weight,uint32_t *version,uint32_t *locktime)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  char *pcVar3;
  Txid local_90;
  uint32_t *local_70;
  string local_68;
  ByteData256 local_48;
  
  local_70 = weight;
  if (txid != (char **)0x0) {
    core::AbstractTransaction::GetTxid(&local_90,tx);
    core::Txid::GetHex_abi_cxx11_(&local_68,&local_90);
    pcVar3 = CreateString(&local_68);
    *txid = pcVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    local_90._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
    if (local_90.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (wtxid != (char **)0x0) {
    core::AbstractTransaction::GetWitnessHash(&local_48,tx);
    core::Txid::Txid(&local_90,&local_48);
    core::Txid::GetHex_abi_cxx11_(&local_68,&local_90);
    pcVar3 = CreateString(&local_68);
    *wtxid = pcVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    local_90._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
    if (local_90.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (size != (uint32_t *)0x0) {
    uVar2 = (*tx->_vptr_AbstractTransaction[4])(tx);
    *size = uVar2;
  }
  if (vsize != (uint32_t *)0x0) {
    uVar2 = (*tx->_vptr_AbstractTransaction[5])(tx);
    *vsize = uVar2;
  }
  puVar1 = local_70;
  if (local_70 != (uint32_t *)0x0) {
    uVar2 = (*tx->_vptr_AbstractTransaction[6])(tx);
    *puVar1 = uVar2;
  }
  if (version != (uint32_t *)0x0) {
    uVar2 = core::AbstractTransaction::GetVersion(tx);
    *version = uVar2;
  }
  if (locktime != (uint32_t *)0x0) {
    uVar2 = core::AbstractTransaction::GetLockTime(tx);
    *locktime = uVar2;
  }
  return;
}

Assistant:

void GetTxInfo(
    AbstractTransaction* tx, char** txid, char** wtxid, uint32_t* size,
    uint32_t* vsize, uint32_t* weight, uint32_t* version, uint32_t* locktime) {
  if (txid != nullptr) {
    *txid = CreateString(tx->GetTxid().GetHex());
  }
  if (wtxid != nullptr) {
    *wtxid = CreateString(Txid(tx->GetWitnessHash()).GetHex());
  }
  if (size != nullptr) {
    *size = tx->GetTotalSize();
  }
  if (vsize != nullptr) {
    *vsize = tx->GetVsize();
  }
  if (weight != nullptr) {
    *weight = tx->GetWeight();
  }
  if (version != nullptr) {
    *version = tx->GetVersion();
  }
  if (locktime != nullptr) {
    *locktime = tx->GetLockTime();
  }
}